

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

position3 * argagg::convert::arg<position3>(position3 *__return_storage_ptr__,char *s)

{
  bool bVar1;
  char *s_local;
  
  __return_storage_ptr__->x = 0.0;
  __return_storage_ptr__->y = 0.0;
  __return_storage_ptr__->z = 0.0;
  s_local = s;
  bVar1 = parse_next_component<double>(&s_local,&__return_storage_ptr__->x,',');
  if (bVar1) {
    bVar1 = parse_next_component<double>(&s_local,&__return_storage_ptr__->y,',');
    if (bVar1) {
      parse_next_component<double>(&s_local,&__return_storage_ptr__->z,',');
    }
  }
  return __return_storage_ptr__;
}

Assistant:

position3 arg(const char* s)
  {
    position3 result {0.0, 0.0, 0.0};
    if (!parse_next_component(s, result.x)) {
      // could potentially throw an error if you require that at least two
      // components exist in the list
      return result;
    }
    if (!parse_next_component(s, result.y)) {
      return result;
    }
    if (!parse_next_component(s, result.z)) {
      return result;
    }
    return result;
  }